

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::ends_with(string *value,string *ending)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  
  psVar1 = (string *)ending->_M_string_length;
  uVar3 = (long)value->_M_string_length - (long)psVar1;
  if (psVar1 <= (string *)value->_M_string_length && uVar3 != 0) {
    iVar2 = std::__cxx11::string::compare((ulong)value,uVar3,psVar1);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

static inline bool
    ends_with(std::string const& value, std::string const& ending)
{
    auto esize = ending.size();
    auto vsize = value.size();
    return (vsize > esize) ?
        (value.compare(vsize - esize, esize, ending) == 0) :
        false;
}